

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

bool __thiscall
UniValue::checkObject
          (UniValue *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
          *t)

{
  pointer pUVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  long in_FS_OFFSET;
  size_t idx;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->typ == VOBJ) {
    p_Var3 = *(_Rb_tree_node_base **)(t + 0x18);
    if (p_Var3 == (_Rb_tree_node_base *)(t + 8)) {
      bVar2 = true;
      goto LAB_00179f6b;
    }
    pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3;
    while( true ) {
      local_40 = 0;
      bVar2 = findKey(this,(string *)(p_Var3 + 1),&local_40);
      if (!bVar2) break;
      if (uVar4 < local_40 || uVar4 - local_40 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     local_40,uVar4);
        }
        goto LAB_00179fad;
      }
      bVar2 = pUVar1[local_40].typ == p_Var3[2]._M_color;
      if ((!bVar2) ||
         (p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3),
         p_Var3 == (_Rb_tree_node_base *)(t + 8))) goto LAB_00179f6b;
    }
  }
  bVar2 = false;
LAB_00179f6b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_00179fad:
  __stack_chk_fail();
}

Assistant:

bool UniValue::checkObject(const std::map<std::string,UniValue::VType>& t) const
{
    if (typ != VOBJ) {
        return false;
    }

    for (const auto& object: t) {
        size_t idx = 0;
        if (!findKey(object.first, idx)) {
            return false;
        }

        if (values.at(idx).getType() != object.second) {
            return false;
        }
    }

    return true;
}